

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_emitObjectFile(sysbvm_bytecodeJit_t *jit)

{
  size_t sVar1;
  size_t sVar2;
  size_t symbolTableOffset;
  size_t stringTableSize;
  size_t stringTableEnd;
  size_t stringTableOffset;
  sysbvm_jit_x64_elfContentFooter_t footer;
  sysbvm_elf64_header_t header;
  sysbvm_bytecodeJit_t *jit_local;
  
  memset(&footer.sections.shstr.entrySize,0,0x40);
  memset(&stringTableOffset,0,0x2e0);
  sVar1 = (jit->objectFileContent).size;
  sVar2 = sysbvm_jit_emitObjectFileCString(jit,"");
  footer.symbols.jittedFunction.size._0_4_ = (undefined4)sVar2;
  sVar2 = sysbvm_jit_emitObjectFileCString(jit,".text");
  footer.sections.null.entrySize._0_4_ = (undefined4)sVar2;
  sVar2 = sysbvm_jit_emitObjectFileCString(jit,".eh_frame");
  footer.sections.text.entrySize._0_4_ = (undefined4)sVar2;
  sVar2 = sysbvm_jit_emitObjectFileCString(jit,".debug_line");
  footer.sections.eh_frame.entrySize._0_4_ = (undefined4)sVar2;
  sVar2 = sysbvm_jit_emitObjectFileCString(jit,".debug_str");
  footer.sections.debug_line.entrySize._0_4_ = (undefined4)sVar2;
  sVar2 = sysbvm_jit_emitObjectFileCString(jit,".debug_abbrev");
  footer.sections.debug_str.entrySize._0_4_ = (undefined4)sVar2;
  sVar2 = sysbvm_jit_emitObjectFileCString(jit,".debug_info");
  footer.sections.debug_abbrev.entrySize._0_4_ = (undefined4)sVar2;
  sVar2 = sysbvm_jit_emitObjectFileCString(jit,".symtab");
  footer.sections.debug_info.entrySize._0_4_ = (undefined4)sVar2;
  sVar2 = sysbvm_jit_emitObjectFileCString(jit,".str");
  footer.sections.symtab.entrySize._0_4_ = (undefined4)sVar2;
  sVar2 = sysbvm_jit_emitObjectFileCString(jit,".shstr");
  footer.sections.str.entrySize._0_4_ = (undefined4)sVar2;
  sVar2 = sysbvm_jit_emitObjectFileSourceFileName(jit);
  footer.symbols.null.size._0_4_ = (undefined4)sVar2;
  footer.symbols.null.size._4_1_ = 4;
  footer.symbols.sourceFile.size._6_2_ = 1;
  footer.symbols.sourceFile.size._4_1_ = 3;
  sVar2 = sysbvm_jit_emitObjectFileJittedFunctionName(jit);
  footer.symbols.text.size._0_4_ = (undefined4)sVar2;
  footer.symbols.text.size._4_1_ = 2;
  footer.symbols.text.size._6_2_ = 1;
  footer.symbols.jittedFunction.name = 0;
  footer.symbols.jittedFunction.info = '\0';
  footer.symbols.jittedFunction.other = '\0';
  footer.symbols.jittedFunction.sectionHeaderIndex = 0;
  footer.symbols.jittedFunction.value = (jit->instructions).size;
  footer.sections.shstr.entrySize._0_1_ = 0x7f;
  footer.sections.shstr.entrySize._1_1_ = 0x45;
  footer.sections.shstr.entrySize._2_1_ = 0x4c;
  footer.sections.shstr.entrySize._3_1_ = 0x46;
  footer.sections.shstr.entrySize._4_1_ = 2;
  footer.sections.shstr.entrySize._5_1_ = 1;
  footer.sections.shstr.entrySize._6_1_ = 1;
  footer.sections.str.offset = (jit->objectFileContent).size - sVar1;
  footer.sections.null.entrySize._4_4_ = 1;
  footer.sections.text.name = 6;
  footer.sections.text.type = 0;
  footer.sections.text.link = 1;
  footer.sections.text.info = 0;
  footer.sections.text.entrySize._4_4_ = 0x70000001;
  footer.sections.eh_frame.name = 2;
  footer.sections.eh_frame.type = 0;
  footer.sections.eh_frame.link = 8;
  footer.sections.eh_frame.info = 0;
  footer.sections.eh_frame.entrySize._4_4_ = 1;
  footer.sections.debug_line.link = 8;
  footer.sections.debug_line.info = 0;
  footer.sections.debug_line.entrySize._4_4_ = 1;
  footer.sections.debug_str.link = 8;
  footer.sections.debug_str.info = 0;
  footer.sections.debug_str.entrySize._4_4_ = 1;
  footer.sections.debug_abbrev.link = 8;
  footer.sections.debug_abbrev.info = 0;
  footer.sections.debug_abbrev.entrySize._4_4_ = 1;
  footer.sections.debug_info.link = 8;
  footer.sections.debug_info.info = 0;
  footer.sections.symtab.entrySize._4_4_ = 3;
  footer.sections.str.link = 1;
  footer.sections.str.info = 0;
  footer.sections.str.entrySize._4_4_ = 3;
  footer.sections.shstr.link = 1;
  footer.sections.shstr.info = 0;
  footer.sections.symtab.address = (jit->objectFileContent).size;
  footer.sections.debug_info.entrySize._4_4_ = 2;
  footer.sections.symtab.addressAlignment = 0x18;
  footer.sections.symtab.link = 1;
  footer.sections.symtab.info = 0;
  footer.sections.symtab.size._0_4_ = 8;
  footer.sections.symtab.size._4_4_ = 4;
  footer.sections.symtab.offset = 0x60;
  footer.sections.str.address = sVar1;
  footer.sections.shstr.address = sVar1;
  footer.sections.shstr.offset = footer.sections.str.offset;
  sysbvm_dynarray_addAll(&jit->objectFileHeader,0x40,&footer.sections.shstr.entrySize);
  sysbvm_dynarray_addAll(&jit->objectFileContent,0x2e0,&stringTableOffset);
  return;
}

Assistant:

static void sysbvm_jit_emitObjectFile(sysbvm_bytecodeJit_t *jit)
{
    sysbvm_elf64_header_t header = {0};
    sysbvm_jit_x64_elfContentFooter_t footer = {0};

    size_t stringTableOffset = jit->objectFileContent.size;
    footer.sections.null.name = (sysbvm_elf64_word_t)sysbvm_jit_emitObjectFileCString(jit, ""); // Null string
    footer.sections.text.name = (sysbvm_elf64_word_t)sysbvm_jit_emitObjectFileCString(jit, ".text");
    footer.sections.eh_frame.name = (sysbvm_elf64_word_t)sysbvm_jit_emitObjectFileCString(jit, ".eh_frame");
    footer.sections.debug_line.name = (sysbvm_elf64_word_t)sysbvm_jit_emitObjectFileCString(jit, ".debug_line");
    footer.sections.debug_str.name = (sysbvm_elf64_word_t)sysbvm_jit_emitObjectFileCString(jit, ".debug_str");
    footer.sections.debug_abbrev.name = (sysbvm_elf64_word_t)sysbvm_jit_emitObjectFileCString(jit, ".debug_abbrev");
    footer.sections.debug_info.name = (sysbvm_elf64_word_t)sysbvm_jit_emitObjectFileCString(jit, ".debug_info");
    footer.sections.symtab.name = (sysbvm_elf64_word_t)sysbvm_jit_emitObjectFileCString(jit, ".symtab");
    footer.sections.str.name = (sysbvm_elf64_word_t)sysbvm_jit_emitObjectFileCString(jit, ".str");
    footer.sections.shstr.name = (sysbvm_elf64_word_t)sysbvm_jit_emitObjectFileCString(jit, ".shstr");

    footer.symbols.sourceFile.name = (sysbvm_elf64_word_t)sysbvm_jit_emitObjectFileSourceFileName(jit);
    footer.symbols.sourceFile.info = SYSBVM_ELF64_SYM_INFO(SYSBVM_STT_FILE, SYSBVM_STB_LOCAL);

    footer.symbols.text.sectionHeaderIndex = 1;
    footer.symbols.text.info = SYSBVM_ELF64_SYM_INFO(SYSBVM_STT_SECTION, SYSBVM_STB_LOCAL);

    footer.symbols.jittedFunction.name = (sysbvm_elf64_word_t)sysbvm_jit_emitObjectFileJittedFunctionName(jit);
    footer.symbols.jittedFunction.info = SYSBVM_ELF64_SYM_INFO(SYSBVM_STT_FUNC, SYSBVM_STB_LOCAL);
    footer.symbols.jittedFunction.sectionHeaderIndex = 1;
    footer.symbols.jittedFunction.value = 0;
    footer.symbols.jittedFunction.size = jit->instructions.size;

    header.ident[SYSBVM_EI_MAG0] = 0x7f;
    header.ident[SYSBVM_EI_MAG1] = 'E';
    header.ident[SYSBVM_EI_MAG2] = 'L';
    header.ident[SYSBVM_EI_MAG3] = 'F';
    header.ident[SYSBVM_EI_CLASS] = SYSBVM_ELFCLASS64;
    header.ident[SYSBVM_EI_DATA] = SYSBVM_ELFDATA2LSB;
    header.ident[SYSBVM_EI_VERSION] = SYSBVM_ELFCURRENT_VERSION;
    header.type = SYSBVM_ET_REL;
    header.machine = SYSBVM_EM_X86_64;
    header.elfHeaderSize = sizeof(header);
    header.version = SYSBVM_ELFCURRENT_VERSION;
    header.sectionHeaderEntrySize = sizeof(footer.sections.null);
    header.sectionHeaderNum = sizeof(footer.sections) / sizeof(footer.sections.null);
    header.sectionHeaderNameStringTableIndex = offsetof(sysbvm_jit_x64_elfSectionHeaders_t, shstr) / sizeof(sysbvm_elf64_sectionHeader_t);

    size_t stringTableEnd = jit->objectFileContent.size;
    size_t stringTableSize = stringTableEnd - stringTableOffset;

    footer.sections.text.type = SYSBVM_SHT_PROGBITS;
    footer.sections.text.flags = SYSBVM_SHF_ALLOC | SYSBVM_SHF_EXECINSTR;
    footer.sections.text.addressAlignment = 1;

    footer.sections.eh_frame.type = sizeof(uintptr_t) == 8 ? SHT_X86_64_UNWIND : SYSBVM_SHT_PROGBITS;
    footer.sections.eh_frame.flags = SYSBVM_SHF_ALLOC;
    footer.sections.eh_frame.addressAlignment = sizeof(uintptr_t);

    footer.sections.debug_line.type = SYSBVM_SHT_PROGBITS;
    footer.sections.debug_line.addressAlignment = sizeof(uintptr_t);

    footer.sections.debug_str.type = SYSBVM_SHT_PROGBITS;
    footer.sections.debug_str.addressAlignment = sizeof(uintptr_t);

    footer.sections.debug_abbrev.type = SYSBVM_SHT_PROGBITS;
    footer.sections.debug_abbrev.addressAlignment = sizeof(uintptr_t);

    footer.sections.debug_info.type = SYSBVM_SHT_PROGBITS;
    footer.sections.debug_info.addressAlignment = sizeof(uintptr_t);

    footer.sections.str.type = SYSBVM_SHT_STRTAB;
    footer.sections.str.offset = stringTableOffset;
    footer.sections.str.addressAlignment = 1;
    footer.sections.str.size = stringTableSize;

    footer.sections.shstr.type = SYSBVM_SHT_STRTAB;
    footer.sections.shstr.offset = stringTableOffset;
    footer.sections.shstr.addressAlignment = 1;
    footer.sections.shstr.size = stringTableSize;

    size_t symbolTableOffset = jit->objectFileContent.size;
    footer.sections.symtab.type = SYSBVM_SHT_SYMTAB;
    footer.sections.symtab.offset = symbolTableOffset;
    footer.sections.symtab.entrySize = sizeof(sysbvm_elf64_symbol_t);
    footer.sections.symtab.addressAlignment = 1;
    footer.sections.symtab.link = offsetof(sysbvm_jit_x64_elfSectionHeaders_t, str) / sizeof(sysbvm_elf64_sectionHeader_t);
    footer.sections.symtab.info = sizeof(sysbvm_jit_x64_elfSymbolTable_t) / sizeof(sysbvm_elf64_symbol_t);
    footer.sections.symtab.size = sizeof(sysbvm_jit_x64_elfSymbolTable_t);

    sysbvm_dynarray_addAll(&jit->objectFileHeader, sizeof(header), &header);
    sysbvm_dynarray_addAll(&jit->objectFileContent, sizeof(footer), &footer);
}